

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

void __thiscall
amrex::DistributionMapping::SFCProcessorMap
          (DistributionMapping *this,BoxArray *boxes,vector<long,_std::allocator<long>_> *wgts,
          int nprocs,Real *eff,bool sort)

{
  byte do_full_knapsack;
  element_type *peVar1;
  Long LVar2;
  int in_ECX;
  vector<long,_std::allocator<long>_> *in_RDX;
  DistributionMapping *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  Real *in_R8;
  byte in_R9B;
  Real *in_stack_00000b80;
  undefined1 in_stack_00000b8b;
  int in_stack_00000b8c;
  vector<long,_std::allocator<long>_> *in_stack_00000b90;
  BoxArray *in_stack_00000b98;
  DistributionMapping *in_stack_00000ba0;
  Ref *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffb8;
  undefined1 sort_00;
  int in_stack_ffffffffffffffd0;
  
  do_full_knapsack = in_R9B & 1;
  std::
  __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0xf59b54);
  Ref::clear(in_stack_ffffffffffffffa0);
  peVar1 = std::
           __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0xf59b66);
  sort_00 = (undefined1)((ulong)peVar1 >> 0x38);
  std::vector<long,_std::allocator<long>_>::size(in_RDX);
  std::vector<int,_std::allocator<int>_>::resize(in_RDI,in_stack_ffffffffffffffb8);
  LVar2 = BoxArray::size((BoxArray *)0xf59b8c);
  if (LVar2 < sfc_threshold * in_ECX) {
    std::numeric_limits<int>::max();
    KnapSackProcessorMap
              (in_RSI,in_RDX,in_ECX,in_R8,(bool)do_full_knapsack,in_stack_ffffffffffffffd0,
               (bool)sort_00);
  }
  else {
    SFCProcessorMapDoIt(in_stack_00000ba0,in_stack_00000b98,in_stack_00000b90,in_stack_00000b8c,
                        (bool)in_stack_00000b8b,in_stack_00000b80);
  }
  return;
}

Assistant:

void
DistributionMapping::SFCProcessorMap (const BoxArray&          boxes,
                                      const std::vector<Long>& wgts,
                                      int                      nprocs,
                                      Real&                    eff,
                                      bool                     sort)
{
    BL_ASSERT(boxes.size() > 0);
    BL_ASSERT(boxes.size() == static_cast<int>(wgts.size()));

    m_ref->clear();
    m_ref->m_pmap.resize(wgts.size());

    if (boxes.size() < sfc_threshold*nprocs)
    {
        KnapSackProcessorMap(wgts,nprocs,&eff);
    }
    else
    {
        SFCProcessorMapDoIt(boxes,wgts,nprocs,sort,&eff);
    }
}